

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void on_recv_data(connection *conn)

{
  ns_connection *pnVar1;
  int iVar2;
  int n;
  iobuf *io;
  connection *conn_local;
  
  pnVar1 = conn->ns_conn;
  if (conn->endpoint_type == EP_PROXY) {
    if ((conn->endpoint).nc != (ns_connection *)0x0) {
      do_proxy(conn);
    }
  }
  else {
    try_parse(conn);
    if ((conn->request_len < 0) ||
       ((0 < conn->request_len && (iVar2 = is_valid_uri((conn->mg_conn).uri), iVar2 == 0)))) {
      send_http_error(conn,400,(char *)0x0);
    }
    else if ((conn->request_len == 0) && (0x4000 < (pnVar1->recv_iobuf).len)) {
      send_http_error(conn,0x19d,(char *)0x0);
    }
    else if ((conn->request_len < 1) ||
            ((iVar2 = strcmp((conn->mg_conn).http_version,"1.0"), iVar2 == 0 ||
             (iVar2 = strcmp((conn->mg_conn).http_version,"1.1"), iVar2 == 0)))) {
      if ((0 < conn->request_len) && (conn->endpoint_type == EP_NONE)) {
        send_websocket_handshake_if_requested(&conn->mg_conn);
        send_continue_if_expected(conn);
        open_local_endpoint(conn,0);
      }
    }
    else {
      send_http_error(conn,0x1f9,(char *)0x0);
    }
    if ((conn->endpoint_type == EP_CGI) && ((conn->endpoint).nc != (ns_connection *)0x0)) {
      ns_forward(conn->ns_conn,(conn->endpoint).nc);
    }
    if (conn->endpoint_type == EP_USER) {
      (conn->mg_conn).content = (pnVar1->recv_iobuf).buf;
      (conn->mg_conn).content_len = (pnVar1->recv_iobuf).len;
      iVar2 = call_user(conn,MG_RECV);
      if (iVar2 < 0) {
        conn->ns_conn->flags = conn->ns_conn->flags | 1;
      }
      else if ((ulong)(long)iVar2 <= (pnVar1->recv_iobuf).len) {
        iobuf_remove(&pnVar1->recv_iobuf,(long)iVar2);
      }
      call_request_handler_if_data_is_buffered(conn);
    }
    if ((conn->endpoint_type == EP_PUT) && ((pnVar1->recv_iobuf).len != 0)) {
      forward_put_data(conn);
    }
  }
  return;
}

Assistant:

static void on_recv_data(struct connection *conn) {
  struct iobuf *io = &conn->ns_conn->recv_iobuf;
  int n;

  if (conn->endpoint_type == EP_PROXY) {
    if (conn->endpoint.nc != NULL) do_proxy(conn);
    return;
  }

  try_parse(conn);
  DBG(("%p %d %lu %d", conn, conn->request_len, (unsigned long)io->len,
       conn->ns_conn->flags));
  if (conn->request_len < 0 ||
      (conn->request_len > 0 && !is_valid_uri(conn->mg_conn.uri))) {
    send_http_error(conn, 400, NULL);
  } else if (conn->request_len == 0 && io->len > MAX_REQUEST_SIZE) {
    send_http_error(conn, 413, NULL);
  } else if (conn->request_len > 0 &&
             strcmp(conn->mg_conn.http_version, "1.0") != 0 &&
             strcmp(conn->mg_conn.http_version, "1.1") != 0) {
    send_http_error(conn, 505, NULL);
  } else if (conn->request_len > 0 && conn->endpoint_type == EP_NONE) {
#ifndef MONGOOSE_NO_WEBSOCKET
    send_websocket_handshake_if_requested(&conn->mg_conn);
#endif
    send_continue_if_expected(conn);
    open_local_endpoint(conn, 0);
  }

#ifndef MONGOOSE_NO_CGI
  if (conn->endpoint_type == EP_CGI && conn->endpoint.nc != NULL) {
    ns_forward(conn->ns_conn, conn->endpoint.nc);
  }
#endif
  if (conn->endpoint_type == EP_USER) {
    conn->mg_conn.content = io->buf;
    conn->mg_conn.content_len = io->len;
    n = call_user(conn, MG_RECV);
    if (n < 0) {
      conn->ns_conn->flags |= NSF_FINISHED_SENDING_DATA;
    } else if ((size_t) n <= io->len) {
      iobuf_remove(io, n);
    }
    call_request_handler_if_data_is_buffered(conn);
  }
#ifndef MONGOOSE_NO_DAV
  if (conn->endpoint_type == EP_PUT && io->len > 0) {
    forward_put_data(conn);
  }
#endif
}